

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImDrawDataBuilder *out_list;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImTextureID texture_id;
  ImDrawList **ppIVar5;
  ImDrawList *pIVar6;
  _func_void_ImDrawData_ptr *p_Var7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int n;
  long lVar15;
  ImGuiWindow *window;
  ulong uVar16;
  float fVar17;
  float fVar18;
  ImVec2 uv [4];
  ImVec2 pos;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 IStack_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar8 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x100e,"void ImGui::Render()");
  }
  iVar11 = GImGui->FrameCountEnded;
  if (iVar11 != GImGui->FrameCount) {
    EndFrame();
    iVar11 = pIVar8->FrameCount;
  }
  pIVar8->FrameCountRendered = iVar11;
  (pIVar8->IO).MetricsActiveWindows = 0;
  (pIVar8->IO).MetricsRenderVertices = 0;
  (pIVar8->IO).MetricsRenderIndices = 0;
  out_list = &pIVar8->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  pIVar4 = pIVar8->NavWindowingTarget;
  window = (ImGuiWindow *)0x0;
  if ((pIVar4 != (ImGuiWindow *)0x0) && ((pIVar4->Flags & 0x2000) == 0)) {
    window = pIVar4;
  }
  uVar12 = (pIVar8->Windows).Size;
  if (uVar12 != 0) {
    uVar16 = 0;
    do {
      pIVar9 = GImGui;
      if ((long)(int)uVar12 <= (long)uVar16) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar4 = (pIVar8->Windows).Data[uVar16];
      if (((pIVar4->Active == true) && (pIVar4->HiddenFrames == 0)) &&
         (uVar3 = pIVar4->Flags, pIVar4 != window && (uVar3 & 0x1000000) == 0)) {
        piVar1 = &(GImGui->IO).MetricsActiveWindows;
        *piVar1 = *piVar1 + 1;
        AddWindowToDrawData((ImVector<ImDrawList_*> *)
                            ((long)&(pIVar9->DrawDataBuilder).Layers[0].Size +
                            (ulong)(uVar3 >> 0x15 & 0x10)),pIVar4);
        uVar12 = (pIVar8->Windows).Size;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar12);
  }
  pIVar9 = GImGui;
  if (((window != (ImGuiWindow *)0x0) && (window->Active == true)) && (window->HiddenFrames == 0)) {
    piVar1 = &(GImGui->IO).MetricsActiveWindows;
    *piVar1 = *piVar1 + 1;
    AddWindowToDrawData((ImVector<ImDrawList_*> *)
                        ((long)&(pIVar9->DrawDataBuilder).Layers[0].Size +
                        (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  IStack_90.x = 0.0;
  IStack_90.y = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  IStack_a0.x = 0.0;
  IStack_a0.y = 0.0;
  if ((pIVar8->IO).MouseDrawCursor == true) {
    bVar10 = ImFontAtlas::GetMouseCursorTexData
                       ((pIVar8->IO).Fonts,pIVar8->MouseCursor,&local_b0,&local_c0,&local_a8,
                        &local_98);
    if (bVar10) {
      IVar2 = (pIVar8->IO).MousePos;
      fVar17 = IVar2.x - local_b0.x;
      fVar18 = IVar2.y - local_b0.y;
      local_78 = CONCAT44(fVar18,fVar17);
      uStack_70 = 0;
      local_60.y = fVar18;
      local_60.x = fVar17;
      texture_id = ((pIVar8->IO).Fonts)->TexID;
      local_58 = ZEXT416((uint)(pIVar8->Style).MouseCursorScale);
      pIVar6 = &pIVar8->OverlayDrawList;
      ImDrawList::PushTextureID(pIVar6,texture_id);
      local_48 = (float)local_58._0_4_ + (float)local_78;
      fStack_44 = (float)local_58._0_4_ * 0.0 + local_78._4_4_;
      fStack_40 = (float)local_58._4_4_ + (float)uStack_70;
      fStack_3c = uStack_70._4_4_ + 0.0;
      local_b8.y = fStack_44;
      local_b8.x = local_48;
      local_88 = (float)local_58._0_4_;
      fStack_84 = (float)local_58._0_4_;
      fStack_80 = (float)local_58._0_4_;
      fStack_7c = (float)local_58._0_4_;
      local_68.y = local_c0.y * (float)local_58._0_4_ + fStack_44;
      local_68.x = local_c0.x * (float)local_58._0_4_ + local_48;
      ImDrawList::AddImage(pIVar6,texture_id,&local_b8,&local_68,&local_98,&IStack_90,0x30000000);
      fVar17 = (float)local_58._0_4_ + (float)local_58._0_4_ + (float)local_78;
      local_b8.y = fStack_44;
      local_b8.x = fVar17;
      local_68.y = local_c0.y * fStack_84 + fStack_44;
      local_68.x = local_c0.x * local_88 + fVar17;
      ImDrawList::AddImage(pIVar6,texture_id,&local_b8,&local_68,&local_98,&IStack_90,0x30000000);
      local_b8.y = local_c0.y * fStack_84 + local_78._4_4_;
      local_b8.x = local_c0.x * local_88 + (float)local_78;
      ImDrawList::AddImage(pIVar6,texture_id,&local_60,&local_b8,&local_98,&IStack_90,0xff000000);
      local_b8.y = local_60.y + local_c0.y * fStack_84;
      local_b8.x = local_60.x + local_c0.x * local_88;
      ImDrawList::AddImage(pIVar6,texture_id,&local_60,&local_b8,&local_a8,&IStack_a0,0xffffffff);
      ImDrawList::PopTextureID(pIVar6);
    }
  }
  if ((pIVar8->OverlayDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar8->OverlayDrawList);
  }
  (pIVar8->DrawData).Valid = true;
  iVar11 = (pIVar8->DrawDataBuilder).Layers[0].Size;
  if ((long)iVar11 < 1) {
    (pIVar8->DrawData).CmdLists = (ImDrawList **)0x0;
    (pIVar8->DrawData).CmdListsCount = iVar11;
    (pIVar8->DrawData).TotalIdxCount = 0;
    (pIVar8->DrawData).TotalVtxCount = 0;
    (pIVar8->IO).MetricsRenderVertices = 0;
    (pIVar8->IO).MetricsRenderIndices = 0;
  }
  else {
    ppIVar5 = (pIVar8->DrawDataBuilder).Layers[0].Data;
    (pIVar8->DrawData).CmdLists = ppIVar5;
    (pIVar8->DrawData).CmdListsCount = iVar11;
    lVar15 = 0;
    iVar13 = 0;
    iVar14 = 0;
    do {
      pIVar6 = ppIVar5[lVar15];
      iVar14 = iVar14 + (pIVar6->VtxBuffer).Size;
      iVar13 = iVar13 + (pIVar6->IdxBuffer).Size;
      lVar15 = lVar15 + 1;
    } while (iVar11 != lVar15);
    (pIVar8->DrawData).TotalVtxCount = iVar14;
    (pIVar8->DrawData).TotalIdxCount = iVar13;
    (pIVar8->IO).MetricsRenderVertices = iVar14;
    (pIVar8->IO).MetricsRenderIndices = iVar13;
    if ((0 < iVar11) &&
       (p_Var7 = (pIVar8->IO).RenderDrawListsFn, p_Var7 != (_func_void_ImDrawData_ptr *)0x0)) {
      (*p_Var7)(&pIVar8->DrawData);
    }
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather windows to render
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* window_to_render_front_most = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->Active && window->HiddenFrames == 0 && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != window_to_render_front_most)
            AddWindowToDrawDataSelectLayer(window);
    }
    if (window_to_render_front_most && window_to_render_front_most->Active && window_to_render_front_most->HiddenFrames == 0) // NavWindowingTarget is always temporarily displayed as the front-most window
        AddWindowToDrawDataSelectLayer(window_to_render_front_most);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    ImVec2 offset, size, uv[4];
    if (g.IO.MouseDrawCursor && g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
    {
        const ImVec2 pos = g.IO.MousePos - offset;
        const ImTextureID tex_id = g.IO.Fonts->TexID;
        const float sc = g.Style.MouseCursorScale;
        g.OverlayDrawList.PushTextureID(tex_id);
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(1,0)*sc, pos+ImVec2(1,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(2,0)*sc, pos+ImVec2(2,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[2], uv[3], IM_COL32(0,0,0,255));       // Black border
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[0], uv[1], IM_COL32(255,255,255,255)); // White fill
        g.OverlayDrawList.PopTextureID();
    }
    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}